

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError checkpasswd(char *kind,char **userpwd)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ParameterError PVar5;
  char passwd [256];
  char prompt [256];
  char acStack_238 [256];
  char local_138 [264];
  
  pcVar4 = *userpwd;
  PVar5 = PARAM_OK;
  if (pcVar4 != (char *)0x0) {
    pcVar1 = strchr(pcVar4,0x3a);
    PVar5 = PARAM_OK;
    if (pcVar1 == (char *)0x0) {
      PVar5 = PARAM_OK;
      memset(acStack_238,0,0x100);
      sVar2 = strlen(pcVar4);
      curl_msnprintf(local_138,0x100,"Enter %s password for user \'%s\':",kind,pcVar4);
      getpass_r(local_138,acStack_238,0x100);
      sVar3 = strlen(acStack_238);
      pcVar4 = (char *)realloc(*userpwd,sVar2 + sVar3 + 2);
      if (pcVar4 == (char *)0x0) {
        PVar5 = PARAM_NO_MEM;
      }
      else {
        pcVar4[sVar2] = ':';
        memcpy(pcVar4 + sVar2 + 1,acStack_238,sVar3 + 1);
        *userpwd = pcVar4;
      }
    }
  }
  return PVar5;
}

Assistant:

ParameterError checkpasswd(const char *kind, /* for what purpose */
                           char **userpwd)   /* pointer to allocated string */
{
  char *ptr;

  if(!*userpwd)
    return PARAM_OK;

  ptr = strchr(*userpwd, ':');
  if(!ptr) {
    /* no password present, prompt for one */
    char passwd[256] = "";
    char prompt[256];
    size_t passwdlen;
    size_t userlen = strlen(*userpwd);
    char *passptr;

    /* build a nice-looking prompt */
    curlx_msnprintf(prompt, sizeof(prompt),
                    "Enter %s password for user '%s':",
                    kind, *userpwd);

    /* get password */
    getpass_r(prompt, passwd, sizeof(passwd));
    passwdlen = strlen(passwd);

    /* extend the allocated memory area to fit the password too */
    passptr = realloc(*userpwd,
                      passwdlen + 1 + /* an extra for the colon */
                      userlen + 1);   /* an extra for the zero */
    if(!passptr)
      return PARAM_NO_MEM;

    /* append the password separated with a colon */
    passptr[userlen] = ':';
    memcpy(&passptr[userlen+1], passwd, passwdlen+1);
    *userpwd = passptr;
  }
  return PARAM_OK;
}